

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::GeneratePrivateMembers(Map *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Type TVar1;
  char *pcVar2;
  char *in_RCX;
  string_view s;
  string_view s_00;
  Sub *local_2f0;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  undefined1 local_289;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  string local_278;
  allocator<char> local_251;
  string local_250;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  string local_220;
  allocator<char> local_1e9;
  string local_1e8;
  Sub *local_1c8;
  Sub local_1c0;
  Sub local_108;
  iterator local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined8 local_18;
  Printer *p_local;
  Map *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  if ((this->lite_ & 1U) == 0) {
    local_289 = 1;
    local_1c8 = &local_1c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"kKeyType",&local_1e9);
    TVar1 = FieldDescriptor::type(this->key_);
    pcVar2 = DeclaredTypeMethodName(TVar1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,pcVar2);
    s._M_str = in_RCX;
    s._M_len = (size_t)local_230._M_str;
    absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(&local_220,(lts_20240722 *)local_230._M_len,s);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_1c0,&local_1e8,&local_220);
    local_1c8 = &local_108;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"kValType",&local_251);
    TVar1 = FieldDescriptor::type(this->val_);
    pcVar2 = DeclaredTypeMethodName(TVar1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_288,pcVar2);
    s_00._M_str = in_RCX;
    s_00._M_len = (size_t)local_288._M_str;
    absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(&local_278,(lts_20240722 *)local_288._M_len,s_00)
    ;
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_108,&local_250,&local_278);
    local_289 = 0;
    local_50 = &local_1c0;
    local_48 = 2;
    v._M_len = 2;
    v._M_array = local_50;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_40._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a0,
               "\n              $pbi$::$MapField$<$Entry$, $Key$, $Val$,\n                                $pbi$::WireFormatLite::TYPE_$kKeyType$,\n                                $pbi$::WireFormatLite::TYPE_$kValType$>\n                  $name$_;\n            "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (p,local_40._M_allocated_capacity,local_40._8_8_,local_2a0._M_len,local_2a0._M_str);
    local_2f0 = (Sub *)&local_50;
    do {
      local_2f0 = local_2f0 + -1;
      io::Printer::Sub::~Sub(local_2f0);
    } while (local_2f0 != &local_1c0);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"\n          $pbi$::MapFieldLite<$Key$, $Val$> $name$_;\n        ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(p,local_28._M_len,local_28._M_str);
  }
  return;
}

Assistant:

void Map::GeneratePrivateMembers(io::Printer* p) const {
  if (lite_) {
    p->Emit(
        R"cc(
          $pbi$::MapFieldLite<$Key$, $Val$> $name$_;
        )cc");
  } else {
    p->Emit({{"kKeyType",
              absl::AsciiStrToUpper(DeclaredTypeMethodName(key_->type()))},
             {"kValType",
              absl::AsciiStrToUpper(DeclaredTypeMethodName(val_->type()))}},
            R"cc(
              $pbi$::$MapField$<$Entry$, $Key$, $Val$,
                                $pbi$::WireFormatLite::TYPE_$kKeyType$,
                                $pbi$::WireFormatLite::TYPE_$kValType$>
                  $name$_;
            )cc");
  }
}